

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::~IfcDoorStyle(IfcDoorStyle *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  
  pvVar2 = *vtt;
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x19];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = vtt[0x1a];
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = vtt[0x1c];
  *(void **)&(this->super_IfcTypeProduct).field_0x148 = vtt[0x1d];
  pcVar3 = (this->Sizeable)._M_dataplus._M_p;
  paVar1 = &(this->Sizeable).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->ParameterTakesPrecedence)._M_dataplus._M_p;
  paVar1 = &(this->ParameterTakesPrecedence).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->ConstructionType)._M_dataplus._M_p;
  paVar1 = &(this->ConstructionType).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)&(this->super_IfcTypeProduct).field_0x158;
  if (puVar4 != &this->field_0x168) {
    operator_delete(puVar4,*(long *)&this->field_0x168 + 1);
  }
  pvVar2 = vtt[1];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x13];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = vtt[0x14];
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x15];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = vtt[0x16];
  pcVar3 = (this->super_IfcTypeProduct).Tag.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcTypeProduct).Tag.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pvVar2 = *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x100;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&(this->super_IfcTypeProduct).field_0x110 - (long)pvVar2);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,vtt + 2);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}